

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Lf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew_00;
  char *pcVar2;
  int c;
  Gia_Man_t *pNew;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  char Buffer [200];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Lf_ManSetDefaultPars((Jf_Par_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002b25a7:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCFARLEDWMekmupstgvwh");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Empty GIA network.\n");
      return 1;
    }
    iVar1 = Gia_ManHasMapping(pAbc->pGia);
    if (iVar1 == 0) {
      if ((Pars.nCutNumMax != 0) && (Pars.fPinFilter != 0)) {
        Abc_Print(-1,"Flags \"-M\" and \"-u\" are incompatible.\n");
        return 1;
      }
      if (Pars.fCutHashing != 0) {
        if (((int)(uint)pPars < 4) || (6 < (int)(uint)pPars)) {
          Abc_Print(-1,"This feature works only for LUT size equal to 4, 5, and 6.\n");
          return 1;
        }
        printf("Using cut grouping for %d-LUTs. Considering cuts up to %d.\n",(ulong)(uint)pPars,
               (ulong)((uint)pPars * 2 + 1));
        pPars._0_4_ = (uint)pPars * 2 + 1;
      }
      pNew_00 = Lf_ManPerformMapping(pAbc->pGia,(Jf_Par_t *)&pPars);
      if (pNew_00 == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Lf(): Mapping into LUTs has failed.\n");
        return 1;
      }
      Abc_FrameUpdateGia(pAbc,pNew_00);
      return 0;
    }
    Abc_Print(-1,"Current AIG has mapping. Run \"&st\".\n");
    return 1;
  }
  switch(iVar1) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-A\" should be followed by a positive integer.\n");
      goto LAB_002b2dca;
    }
    Pars.nProcNum = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nProcNum;
    break;
  default:
    goto switchD_002b25f9_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by a positive integer.\n");
      goto LAB_002b2dca;
    }
    pPars._4_4_ = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (((int)pPars._4_4_ < 1) || (Pars.fVeryVerbose < (int)pPars._4_4_)) {
      Abc_Print(-1,"This number of cuts (%d) is not supported.\n",(ulong)pPars._4_4_);
      goto LAB_002b2dca;
    }
    goto LAB_002b25a7;
  case 0x44:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by a floating point number.\n");
      goto LAB_002b2dca;
    }
    Pars.nDelayLut2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((double)Pars.nDelayLut2 <= 0.0) goto LAB_002b2dca;
    goto LAB_002b25a7;
  case 0x45:
    if (argc <= globalUtilOptind) {
      Abc_Print(1,"Command line switch \"-E\" should be followed by a floating point number.\n");
      return 0;
    }
    Pars.nRelaxRatio = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nRelaxRatio;
    break;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by a positive integer.\n");
      goto LAB_002b2dca;
    }
    Pars.nCutNum = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nCutNum;
    break;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-K\" should be followed by a positive integer.\n");
      goto LAB_002b2dca;
    }
    pPars._0_4_ = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (((int)(uint)pPars < 2) || (Pars.fVerbose < (int)(uint)pPars)) {
      Abc_Print(-1,"LUT size %d is not supported.\n",(ulong)(uint)pPars);
      goto LAB_002b2dca;
    }
    goto LAB_002b25a7;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      Abc_Print(1,"Command line switch \"-R\" should be followed by a floating point number.\n");
      return 0;
    }
    Pars.nRoundsEla = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nRoundsEla;
    break;
  case 0x4d:
    if (globalUtilOptind < argc) goto LAB_002b2ac3;
    Abc_Print(-1,"Command line switch \"-M\" should be followed by a positive integer.\n");
    goto LAB_002b2dca;
  case 0x52:
    if (argc <= globalUtilOptind) {
      Abc_Print(1,"Command line switch \"-R\" should be followed by a floating point number.\n");
      return 0;
    }
    Pars.nRounds = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nRounds;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by a positive integer.\n");
      goto LAB_002b2dca;
    }
    Pars.nAreaTuner = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nAreaTuner;
    break;
  case 0x61:
    Pars.nFastEdges = Pars.nFastEdges ^ 1;
    goto LAB_002b25a7;
  case 0x65:
    Pars.fPinQuick = Pars.fPinQuick ^ 1;
    goto LAB_002b25a7;
  case 0x67:
    Pars.fCutHashing = Pars.fCutHashing ^ 1;
    goto LAB_002b25a7;
  case 0x68:
switchD_002b25f9_caseD_42:
    goto LAB_002b2dca;
  case 0x6b:
    Pars.fUseMux7 = Pars.fUseMux7 ^ 1;
    goto LAB_002b25a7;
  case 0x6d:
    Pars.fPower = Pars.fPower ^ 1;
    goto LAB_002b25a7;
  case 0x70:
    Pars.fOptEdge = Pars.fOptEdge ^ 1;
    goto LAB_002b25a7;
  case 0x73:
    Pars.fAddOrCla = Pars.fAddOrCla ^ 1;
    goto LAB_002b25a7;
  case 0x74:
    Pars.fCnfMapping = Pars.fCnfMapping ^ 1;
    goto LAB_002b25a7;
  case 0x75:
    Pars.fPinFilter = Pars.fPinFilter ^ 1;
    goto LAB_002b25a7;
  case 0x76:
    Pars.fCutSimple = Pars.fCutSimple ^ 1;
    goto LAB_002b25a7;
  case 0x77:
    Pars.fCutGroup = Pars.fCutGroup ^ 1;
    goto LAB_002b25a7;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (iVar1 < 0) goto LAB_002b2dca;
  goto LAB_002b25a7;
LAB_002b2ac3:
  Pars.nCutNumMax = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((Pars.nCutNumMax < 2) || (Pars.fVerbose < Pars.nCutNumMax)) {
    Abc_Print(-1,"LUT size %d is not supported.\n",(ulong)(uint)Pars.nCutNumMax);
LAB_002b2dca:
    if (Pars.nDelayLut2 == -1) {
      sprintf((char *)&Pars.pTimesReq,"best possible");
    }
    else {
      sprintf((char *)&Pars.pTimesReq,"%d",(ulong)(uint)Pars.nDelayLut2);
    }
    Abc_Print(-2,"usage: &lf [-KCFARLEDM num] [-kmupstgvwh]\n");
    Abc_Print(-2,"\t           performs technology mapping of the network\n");
    Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
              (ulong)(uint)Pars.fVerbose,(ulong)(uint)pPars);
    Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
              (ulong)(uint)Pars.fVeryVerbose,(ulong)pPars._4_4_);
    Abc_Print(-2,"\t-F num   : the number of area flow rounds [default = %d]\n",
              (ulong)(uint)Pars.nCutNum);
    Abc_Print(-2,"\t-A num   : the number of exact area rounds [default = %d]\n",
              (ulong)(uint)Pars.nProcNum);
    Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
              (ulong)(uint)Pars.nRounds);
    Abc_Print(-2,"\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n",
              (ulong)(uint)Pars.nRoundsEla);
    Abc_Print(-2,"\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n",
              (ulong)(uint)Pars.nRelaxRatio);
    Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
              &Pars.pTimesReq);
    Abc_Print(-2,
              "\t-M num   : LUT size when cofactoring is performed (0 <= num <= 100) [default = %d]\n"
              ,(ulong)(uint)Pars.nCutNumMax);
    pcVar2 = "no";
    if (Pars.fPinQuick != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-e       : toggles edge vs node minimization [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fUseMux7 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fPower != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fPinFilter != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-u       : toggles using additional MUXes [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fOptEdge != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-p       : toggles power-aware cut selection heuristics [default = %s]\n",pcVar2
             );
    pcVar2 = "no";
    if (Pars.fAddOrCla != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-s       : toggles generating AIG without mapping [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fCnfMapping != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,
              "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n",
              pcVar2);
    pcVar2 = "no";
    if (Pars.fCutHashing != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-g       : toggles using cut splitting [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fCutSimple != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (Pars.fCutGroup != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h       : prints the command usage\n");
    return 1;
  }
  goto LAB_002b25a7;
}

Assistant:

int Abc_CommandAbc9Lf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Lf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFARLEDWMekmupstgvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRoundsEla = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRoundsEla < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nCoarseLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCoarseLimit < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-E\" should be followed by a floating point number.\n" );
                return 0;
            }
            pPars->nAreaTuner = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaTuner < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSizeMux = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSizeMux < 2 || pPars->nLutSizeMux > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSizeMux );
                goto usage;
            }
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'e':
            pPars->fOptEdge ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 'u':
            pPars->fUseMux7 ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 's':
            pPars->fPureAig ^= 1;
            break;
        case 't':
            pPars->fDoAverage ^= 1;
            break;
        case 'g':
            pPars->fCutGroup ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Current AIG has mapping. Run \"&st\".\n" );
        return 1;
    }
    if ( pPars->nLutSizeMux && pPars->fUseMux7 )
    {
        Abc_Print( -1, "Flags \"-M\" and \"-u\" are incompatible.\n" );
        return 1;
    }
    if ( pPars->fCutGroup )
    {
        if ( pPars->nLutSize < 4 || pPars->nLutSize > 6 )
        {
            Abc_Print( -1, "This feature works only for LUT size equal to 4, 5, and 6.\n" );
            return 1;
        }
        printf( "Using cut grouping for %d-LUTs. Considering cuts up to %d.\n", pPars->nLutSize, 2*pPars->nLutSize + 1 );
        pPars->nLutSize = 2*pPars->nLutSize + 1;
    }
    pNew = Lf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Lf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &lf [-KCFARLEDM num] [-kmupstgvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-F num   : the number of area flow rounds [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-A num   : the number of exact area rounds [default = %d]\n", pPars->nRoundsEla );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n", pPars->nRelaxRatio );
    Abc_Print( -2, "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n", pPars->nCoarseLimit );
    Abc_Print( -2, "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n", pPars->nAreaTuner );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-M num   : LUT size when cofactoring is performed (0 <= num <= 100) [default = %d]\n", pPars->nLutSizeMux );
//    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-e       : toggles edge vs node minimization [default = %s]\n", pPars->fOptEdge? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n", pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-u       : toggles using additional MUXes [default = %s]\n", pPars->fUseMux7? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggles power-aware cut selection heuristics [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles generating AIG without mapping [default = %s]\n", pPars->fPureAig? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles optimizing average rather than maximum level [default = %s]\n", pPars->fDoAverage? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles using cut splitting [default = %s]\n", pPars->fCutGroup? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}